

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_GIF.cpp
# Opt level: O3

int __thiscall Am_GIF_Image::load_gif_colormap(Am_GIF_Image *this,ifstream *ifs,int flags)

{
  undefined1 auVar1 [16];
  undefined8 in_RAX;
  ulong uVar2;
  Am_RGB_Value *pAVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uchar buf [3];
  undefined8 uStack_38;
  
  iVar4 = 2 << ((byte)flags & 7);
  (this->super_Am_Generic_Image).iminfo.num_colors = iVar4;
  pAVar3 = (this->super_Am_Generic_Image).color_map;
  uStack_38 = in_RAX;
  if (pAVar3 != (Am_RGB_Value *)0x0) {
    operator_delete__(pAVar3);
    iVar4 = (this->super_Am_Generic_Image).iminfo.num_colors;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar4;
  uVar2 = SUB168(auVar1 * ZEXT816(6),0);
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(6),8) == 0) {
    uVar5 = uVar2;
  }
  pAVar3 = (Am_RGB_Value *)operator_new__(uVar5);
  if (iVar4 == 0) {
    (this->super_Am_Generic_Image).color_map = pAVar3;
  }
  else {
    memset(pAVar3,0,((uVar2 - 6) / 6) * 6 + 6);
    (this->super_Am_Generic_Image).color_map = pAVar3;
    if (0 < iVar4) {
      lVar6 = 4;
      lVar7 = 0;
      do {
        std::istream::read((char *)ifs,(long)&uStack_38 + 5);
        pAVar3 = (this->super_Am_Generic_Image).color_map;
        *(ushort *)((long)pAVar3 + lVar6 + -4) = (ushort)uStack_38._5_1_;
        *(ushort *)((long)pAVar3 + lVar6 + -2) = (ushort)uStack_38._6_1_;
        *(ushort *)((long)&pAVar3->red + lVar6) = (ushort)uStack_38._7_1_;
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 6;
      } while (lVar7 < (this->super_Am_Generic_Image).iminfo.num_colors);
    }
  }
  return 1;
}

Assistant:

int
Am_GIF_Image::load_gif_colormap(std::ifstream &ifs, int flags)
{
  //  iminfo.depth = CTSIZE(flags) + 1; set in caller
  //  iminfo.num_colors = 1 << iminfo.depth;
  iminfo.num_colors = 1 << (CTSIZE(flags) + 1);
  // if we have a color map, delete it before reallocating
  if (color_map != nullptr)
    delete[] color_map;
  color_map = new Am_RGB_Value[iminfo.num_colors];
  if (color_map == nullptr)
    return 0; // failure
  int i;
  unsigned char buf[3];
  for (i = 0; i < iminfo.num_colors; i++) {
    // ifs.read(buf, 3);  MSL
    ifs.read((char *)buf, 3);
    color_map[i].red = buf[0];
    color_map[i].green = buf[1];
    color_map[i].blue = buf[2];
  }
  return 1;
}